

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_parse_mem_(ly_ctx *ctx,char *data,LYS_INFORMAT format,int internal)

{
  int iVar1;
  LY_ERR *pLVar2;
  size_t sVar3;
  lys_ext_instance **pplVar4;
  lys_ext_instance *plVar5;
  char *pcVar6;
  long *plVar7;
  void *pvVar8;
  uint local_5c;
  int i;
  lys_type **type;
  lys_ext_instance_complex *op;
  void *reallocated;
  ly_ctx *plStack_38;
  uint len;
  lys_module *mod;
  char *enlarged_data;
  int internal_local;
  LYS_INFORMAT format_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  mod = (lys_module *)0x0;
  plStack_38 = (ly_ctx *)0x0;
  ly_err_clean(1);
  if ((ctx == (ly_ctx *)0x0) || (data == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lys_parse_mem_");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    _internal_local = (lys_module *)data;
    if ((internal == 0) && (format == LYS_IN_YANG)) {
      sVar3 = strlen(data);
      mod = (lys_module *)malloc((ulong)((int)sVar3 + 2));
      if (mod == (lys_module *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_parse_mem_");
        return (lys_module *)0x0;
      }
      memcpy(mod,data,sVar3 & 0xffffffff);
      *(undefined1 *)((long)&mod->ctx + (ulong)((int)sVar3 + 1)) = 0;
      *(undefined1 *)((long)&mod->ctx + (sVar3 & 0xffffffff)) = 0;
      _internal_local = mod;
    }
    if (format == LYS_IN_YANG) {
      plStack_38 = (ly_ctx *)yang_read_module(ctx,(char *)_internal_local,0,(char *)0x0,1);
    }
    else if (format == LYS_IN_YIN) {
      plStack_38 = (ly_ctx *)yin_read_module(ctx,(char *)_internal_local,(char *)0x0,1);
    }
    else {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      ly_log(LY_LLERR,"Invalid schema input format.");
    }
    free(mod);
    if ((plStack_38 != (ly_ctx *)0x0) &&
       (iVar1 = ly_strequal_((plStack_38->dict).recs[0].value,"ietf-netconf"), iVar1 != 0)) {
      pplVar4 = (lys_ext_instance **)
                realloc((plStack_38->dict).recs[6].value,
                        (long)(int)(*(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) + 3) <<
                        3);
      if (pplVar4 == (lys_ext_instance **)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_parse_mem_");
        lys_free((lys_module *)plStack_38,(_func_void_lys_node_ptr_void_ptr *)0x0,1);
        return (lys_module *)0x0;
      }
      (plStack_38->dict).recs[6].value = (char *)pplVar4;
      plVar5 = (lys_ext_instance *)calloc(1,0x6a);
      *(lys_ext_instance **)
       ((long)(plStack_38->dict).recs[6].value +
       (ulong)*(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) * 8) = plVar5;
      pcVar6 = lydict_insert(ctx,"operation",9);
      plVar5->arg_value = pcVar6;
      plVar5->def = (*(ctx->models).list)->extensions;
      plVar5->ext_type = '\x01';
      plVar5->parent = plStack_38;
      plVar5[1].parent = plStack_38;
      plVar5->parent_type = '\0';
      plVar5[1].def = *(lys_ext **)(plVar5->def->plugin + 1);
      *(undefined4 *)&plVar5[1].arg_value = 0x10000;
      plVar7 = (long *)((long)&plVar5[1].arg_value + 4);
      pvVar8 = calloc(1,0x40);
      *plVar7 = (long)pvVar8;
      *(undefined4 *)(*plVar7 + 8) = 6;
      *(lys_tpdf **)(*plVar7 + 0x18) = ly_types[6];
      *(lys_ext_instance **)(*plVar7 + 0x20) = plVar5;
      *(undefined4 *)(*plVar7 + 0x30) = 5;
      pvVar8 = calloc(5,0x30);
      *(void **)(*plVar7 + 0x28) = pvVar8;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0x1c) = 0;
      pcVar6 = lydict_insert(ctx,"merge",5);
      **(undefined8 **)(*plVar7 + 0x28) = pcVar6;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0x4c) = 1;
      pcVar6 = lydict_insert(ctx,"replace",7);
      *(char **)(*(long *)(*plVar7 + 0x28) + 0x30) = pcVar6;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0x7c) = 2;
      pcVar6 = lydict_insert(ctx,"create",6);
      *(char **)(*(long *)(*plVar7 + 0x28) + 0x60) = pcVar6;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0xac) = 3;
      pcVar6 = lydict_insert(ctx,"delete",6);
      *(char **)(*(long *)(*plVar7 + 0x28) + 0x90) = pcVar6;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0xdc) = 4;
      pcVar6 = lydict_insert(ctx,"remove",6);
      *(char **)(*(long *)(*plVar7 + 0x28) + 0xc0) = pcVar6;
      *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) =
           *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) + '\x01';
      plVar5 = (lys_ext_instance *)calloc(1,0x6a);
      *(lys_ext_instance **)
       ((long)(plStack_38->dict).recs[6].value +
       (ulong)*(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) * 8) = plVar5;
      pcVar6 = lydict_insert(ctx,"type",4);
      plVar5->arg_value = pcVar6;
      plVar5->def = (*(ctx->models).list)->extensions;
      plVar5->ext_type = '\x01';
      plVar5->parent = plStack_38;
      plVar5[1].parent = plStack_38;
      plVar5->parent_type = '\0';
      plVar5[1].def = *(lys_ext **)(plVar5->def->plugin + 1);
      *(undefined4 *)&plVar5[1].arg_value = 0x10000;
      plVar7 = (long *)((long)&plVar5[1].arg_value + 4);
      pvVar8 = calloc(1,0x40);
      *plVar7 = (long)pvVar8;
      *(undefined4 *)(*plVar7 + 8) = 6;
      *(lys_tpdf **)(*plVar7 + 0x18) = ly_types[6];
      *(lys_ext_instance **)(*plVar7 + 0x20) = plVar5;
      *(undefined4 *)(*plVar7 + 0x30) = 2;
      pvVar8 = calloc(2,0x30);
      *(void **)(*plVar7 + 0x28) = pvVar8;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0x1c) = 0;
      pcVar6 = lydict_insert(ctx,"subtree",7);
      **(undefined8 **)(*plVar7 + 0x28) = pcVar6;
      *(undefined4 *)(*(long *)(*plVar7 + 0x28) + 0x4c) = 1;
      pcVar6 = lydict_insert(ctx,"xpath",5);
      *(char **)(*(long *)(*plVar7 + 0x28) + 0x30) = pcVar6;
      for (local_5c = (uint)(byte)(plStack_38->dict).recs[2].field_0x17; 0 < (int)local_5c;
          local_5c = local_5c - 1) {
        iVar1 = strcmp(((lys_feature *)(plStack_38->dict).recs[5].next)[(int)(local_5c - 1)].name,
                       "xpath");
        if (iVar1 == 0) {
          *(undefined1 *)(*(long *)(*plVar7 + 0x28) + 0x4b) = 1;
          pvVar8 = calloc(1,0x40);
          *(void **)(*(long *)(*plVar7 + 0x28) + 0x58) = pvVar8;
          pvVar8 = malloc(1);
          **(undefined8 **)(*(long *)(*plVar7 + 0x28) + 0x58) = pvVar8;
          *(undefined1 *)**(undefined8 **)(*(long *)(*plVar7 + 0x28) + 0x58) = 3;
          pvVar8 = malloc(8);
          *(void **)(*(long *)(*(long *)(*plVar7 + 0x28) + 0x58) + 0x10) = pvVar8;
          **(long **)(*(long *)(*(long *)(*plVar7 + 0x28) + 0x58) + 0x10) =
               (long)((lys_feature *)(plStack_38->dict).recs[5].next + (int)(local_5c - 1));
          break;
        }
      }
      *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) =
           *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) + '\x01';
      plVar5 = (lys_ext_instance *)calloc(1,0x6a);
      *(lys_ext_instance **)
       ((long)(plStack_38->dict).recs[6].value +
       (ulong)*(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) * 8) = plVar5;
      pcVar6 = lydict_insert(ctx,"select",6);
      plVar5->arg_value = pcVar6;
      plVar5->def = (*(ctx->models).list)->extensions;
      plVar5->ext_type = '\x01';
      plVar5->parent = plStack_38;
      plVar5[1].parent = plStack_38;
      plVar5->parent_type = '\0';
      plVar5[1].def = *(lys_ext **)(plVar5->def->plugin + 1);
      *(undefined4 *)&plVar5[1].arg_value = 0x10000;
      plVar7 = (long *)((long)&plVar5[1].arg_value + 4);
      pvVar8 = calloc(1,0x40);
      *plVar7 = (long)pvVar8;
      *(undefined4 *)(*plVar7 + 8) = 10;
      *(lys_tpdf **)(*plVar7 + 0x18) = ly_types[10];
      *(lys_ext_instance **)(*plVar7 + 0x20) = plVar5;
      *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) =
           *(uint8_t *)((long)&(plStack_38->dict).recs[3].next + 3) + '\x01';
    }
    ctx_local = plStack_38;
  }
  return (lys_module *)ctx_local;
}

Assistant:

static const struct lys_module *
lys_parse_mem_(struct ly_ctx *ctx, const char *data, LYS_INFORMAT format, int internal)
{
    char *enlarged_data = NULL;
    struct lys_module *mod = NULL;
    unsigned int len;
    void *reallocated;
    struct lys_ext_instance_complex *op;
    struct lys_type **type;
    int i;

    ly_err_clean(1);

    if (!ctx || !data) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    if (!internal && format == LYS_IN_YANG) {
        /* enlarge data by 2 bytes for flex */
        len = strlen(data);
        enlarged_data = malloc((len + 2) * sizeof *enlarged_data);
        if (!enlarged_data) {
            LOGMEM;
            return NULL;
        }
        memcpy(enlarged_data, data, len);
        enlarged_data[len] = enlarged_data[len + 1] = '\0';
        data = enlarged_data;
    }

    switch (format) {
    case LYS_IN_YIN:
        mod = yin_read_module(ctx, data, NULL, 1);
        break;
    case LYS_IN_YANG:
        mod = yang_read_module(ctx, data, 0, NULL, 1);
        break;
    default:
        LOGERR(LY_EINVAL, "Invalid schema input format.");
        break;
    }

    free(enlarged_data);

    /* hack for NETCONF's edit-config's operation attribute. It is not defined in the schema, but since libyang
     * implements YANG metadata (annotations), we need its definition. Because the ietf-netconf schema is not the
     * internal part of libyang, we cannot add the annotation into the schema source, but we do it here to have
     * the anotation definitions available in the internal schema structure. There is another hack in schema
     * printers to do not print this internally added annotation. */
    if (mod && ly_strequal(mod->name, "ietf-netconf", 0)) {
        reallocated = realloc(mod->ext, (mod->ext_size + 3) * sizeof *mod->ext);
        if (!reallocated) {
            LOGMEM;
            lys_free(mod, NULL, 1);
            return NULL;
        }
        mod->ext = reallocated;
        /* 1) edit-config's operation */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "operation", 9);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_ENUM;
        (*type)->der = ly_types[LY_TYPE_ENUM];
        (*type)->parent = (struct lys_tpdf *)op;
        (*type)->info.enums.count = 5;
        (*type)->info.enums.enm = calloc(5, sizeof *(*type)->info.enums.enm);
        (*type)->info.enums.enm[0].value = 0;
        (*type)->info.enums.enm[0].name = lydict_insert(ctx, "merge", 5);
        (*type)->info.enums.enm[1].value = 1;
        (*type)->info.enums.enm[1].name = lydict_insert(ctx, "replace", 7);
        (*type)->info.enums.enm[2].value = 2;
        (*type)->info.enums.enm[2].name = lydict_insert(ctx, "create", 6);
        (*type)->info.enums.enm[3].value = 3;
        (*type)->info.enums.enm[3].name = lydict_insert(ctx, "delete", 6);
        (*type)->info.enums.enm[4].value = 4;
        (*type)->info.enums.enm[4].name = lydict_insert(ctx, "remove", 6);
        mod->ext_size++;

        /* 2) filter's type */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "type", 4);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_ENUM;
        (*type)->der = ly_types[LY_TYPE_ENUM];
        (*type)->parent = (struct lys_tpdf *)op;
        (*type)->info.enums.count = 2;
        (*type)->info.enums.enm = calloc(2, sizeof *(*type)->info.enums.enm);
        (*type)->info.enums.enm[0].value = 0;
        (*type)->info.enums.enm[0].name = lydict_insert(ctx, "subtree", 7);
        (*type)->info.enums.enm[1].value = 1;
        (*type)->info.enums.enm[1].name = lydict_insert(ctx, "xpath", 5);
        for (i = mod->features_size; i > 0; i--) {
            if (!strcmp(mod->features[i - 1].name, "xpath")) {
                (*type)->info.enums.enm[1].iffeature_size = 1;
                (*type)->info.enums.enm[1].iffeature = calloc(1, sizeof(struct lys_feature));
                (*type)->info.enums.enm[1].iffeature[0].expr = malloc(sizeof(uint8_t));
                *(*type)->info.enums.enm[1].iffeature[0].expr = 3; /* LYS_IFF_F */
                (*type)->info.enums.enm[1].iffeature[0].features = malloc(sizeof(struct lys_feature*));
                (*type)->info.enums.enm[1].iffeature[0].features[0] = &mod->features[i - 1];
                break;
            }
        }
        mod->ext_size++;

        /* 3) filter's select */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "select", 6);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_STRING;
        (*type)->der = ly_types[LY_TYPE_STRING];
        (*type)->parent = (struct lys_tpdf *)op;
        mod->ext_size++;
    }

    return mod;
}